

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere_drawing.cpp
# Opt level: O0

void CGL::Misc::draw_sphere_wireframe_opengl(Vector3D *p,double r,Color *c)

{
  uint uVar1;
  uint uVar2;
  undefined8 *in_RDI;
  undefined8 in_XMM0_Qa;
  double *vPtr3;
  double *vPtr2;
  double *vPtr1;
  int i;
  int local_1c;
  
  if (!initialized) {
    init_mesh();
    initialized = true;
  }
  glMatrixMode(0x1700);
  glPushMatrix();
  glTranslated(*in_RDI,in_RDI[1],in_RDI[2]);
  glScaled(in_XMM0_Qa,in_XMM0_Qa,in_XMM0_Qa);
  for (local_1c = 0; local_1c < 48000; local_1c = local_1c + 3) {
    glBegin(2);
    uVar1 = Indices[local_1c + 1];
    uVar2 = Indices[local_1c + 2];
    glVertex3dv((ulong)(Indices[local_1c] << 3) * 8 + 0x3a6f98);
    glVertex3dv((ulong)(uVar1 << 3) * 8 + 0x3a6f98);
    glVertex3dv((ulong)(uVar2 << 3) * 8 + 0x3a6f98);
    glEnd();
  }
  glPopMatrix();
  return;
}

Assistant:

void draw_sphere_wireframe_opengl(const Vector3D& p, double r, const Color& c) {
  if (!initialized) {
    init_mesh();
    initialized = true;
  }

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glTranslated(p.x, p.y, p.z);
  glScaled(r, r, r);

  for (int i = 0; i < SPHERE_NUM_INDICES; i += 3) {
    glBegin(GL_LINE_LOOP);
    double *vPtr1 = &Vertices[VERTEX_SIZE * Indices[i]];
    double *vPtr2 = &Vertices[VERTEX_SIZE * Indices[i + 1]];
    double *vPtr3 = &Vertices[VERTEX_SIZE * Indices[i + 2]];
    glVertex3dv(vPtr1 + VERTEX_OFFSET);
    glVertex3dv(vPtr2 + VERTEX_OFFSET);
    glVertex3dv(vPtr3 + VERTEX_OFFSET);
    glEnd();
  }

  glPopMatrix();

}